

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitArraySet(FunctionValidator *this,ArraySet *curr)

{
  Type left;
  bool bVar1;
  HeapType HVar2;
  Type local_48;
  int local_3c;
  Type local_38;
  uintptr_t local_30;
  
  shouldBeTrue<wasm::ArraySet*>
            (this,(bool)((byte)((((this->
                                  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .
                                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                 .currModule)->features).features >> 10) & 1),curr,
             "array.set requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable<wasm::ArraySet*,wasm::Type>
            (this,(Type)(curr->index->type).id,(Type)0x2,curr,"array.set index must be an i32");
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)67>).super_Expression.type.id != 1) {
    left.id = (curr->ref->type).id;
    wasm::Type::Type(&local_38,(HeapType)0x6,Nullable);
    bVar1 = shouldBeSubType(this,left,local_38,(Expression *)curr,
                            "array.set target should be an array reference");
    if (bVar1) {
      HVar2 = wasm::Type::getHeapType(&curr->ref->type);
      if (HVar2.id != 0xb) {
        bVar1 = shouldBeTrue<wasm::ArraySet*>
                          (this,HVar2.id != 6,curr,
                           "array.set target should be a specific array reference");
        if (bVar1) {
          local_30 = (uintptr_t)wasm::Type::getHeapType(&curr->ref->type);
          HeapType::getArray((HeapType *)&local_48);
          shouldBeSubType(this,(Type)(curr->value->type).id,local_48,(Expression *)curr,
                          "array.set must have the proper type");
          shouldBeTrue<wasm::ArraySet*>(this,local_3c != 0,curr,"array.set type must be mutable");
        }
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArraySet(ArraySet* curr) {
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "array.set requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->index->type, Type(Type::i32), curr, "array.set index must be an i32");
  if (curr->type == Type::unreachable) {
    return;
  }
  if (!shouldBeSubType(curr->ref->type,
                       Type(HeapType::array, Nullable),
                       curr,
                       "array.set target should be an array reference")) {
    return;
  }
  auto heapType = curr->ref->type.getHeapType();
  if (heapType == HeapType::none) {
    return;
  }
  if (!shouldBeTrue(heapType != HeapType::array,
                    curr,
                    "array.set target should be a specific array reference")) {
    return;
  }
  const auto& element = curr->ref->type.getHeapType().getArray().element;
  shouldBeSubType(curr->value->type,
                  element.type,
                  curr,
                  "array.set must have the proper type");
  shouldBeTrue(element.mutable_, curr, "array.set type must be mutable");
}